

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_logical_operator.cpp
# Opt level: O2

unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true> __thiscall
duckdb::LogicalSimple::Deserialize(LogicalSimple *this,Deserializer *deserializer)

{
  LogicalOperatorType type;
  LogicalSimple *this_00;
  pointer *__ptr;
  _Head_base<0UL,_duckdb::ParseInfo_*,_false> local_28;
  ParseInfo *local_20;
  
  Deserializer::
  ReadPropertyWithDefault<duckdb::unique_ptr<duckdb::ParseInfo,std::default_delete<duckdb::ParseInfo>,true>>
            ((Deserializer *)&stack0xffffffffffffffe0,(field_id_t)deserializer,(char *)0xc8);
  this_00 = (LogicalSimple *)operator_new(0x70);
  type = SerializationData::Get<duckdb::LogicalOperatorType>(&deserializer->data);
  local_28._M_head_impl = local_20;
  local_20 = (ParseInfo *)0x0;
  LogicalSimple(this_00,type,
                (unique_ptr<duckdb::ParseInfo,_std::default_delete<duckdb::ParseInfo>,_true> *)
                &local_28);
  if (local_28._M_head_impl != (ParseInfo *)0x0) {
    (*(local_28._M_head_impl)->_vptr_ParseInfo[1])();
  }
  local_28._M_head_impl = (ParseInfo *)0x0;
  (this->super_LogicalOperator)._vptr_LogicalOperator = (_func_int **)this_00;
  if (local_20 != (ParseInfo *)0x0) {
    (**(code **)(*(_func_int **)local_20 + 8))();
  }
  return (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)
         (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)this;
}

Assistant:

unique_ptr<LogicalOperator> LogicalSimple::Deserialize(Deserializer &deserializer) {
	auto info = deserializer.ReadPropertyWithDefault<unique_ptr<ParseInfo>>(200, "info");
	auto result = duckdb::unique_ptr<LogicalSimple>(new LogicalSimple(deserializer.Get<LogicalOperatorType>(), std::move(info)));
	return std::move(result);
}